

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

void __thiscall Clasp::Cli::ClaspAppBase::run(ClaspAppBase *this)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  pointer pbVar8;
  
  plVar7 = (long *)((this->out_).ptr_ & 0xfffffffffffffffe);
  if (plVar7 != (long *)0x0) {
    pbVar1 = (this->claspAppOpts_).input.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->claspAppOpts_).input.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)pbVar2 - (long)pbVar1;
    pbVar8 = (pointer)&stdinStr_abi_cxx11_;
    if (uVar5 != 0) {
      pbVar8 = pbVar1;
    }
    uVar6 = 1;
    if (pbVar2 != pbVar1) {
      uVar6 = uVar5 >> 5;
    }
    iVar3 = (**(this->super_Application)._vptr_Application)(this);
    iVar4 = (*(this->super_Application)._vptr_Application[1])(this);
    (**(code **)(*plVar7 + 0x28))(plVar7,iVar3,iVar4,pbVar8,pbVar8 + uVar6);
  }
  (*(this->super_Application)._vptr_Application[0x16])
            (this,(this->clasp_).ptr_ & 0xfffffffffffffffe);
  return;
}

Assistant:

void ClaspAppBase::run() {
	if (out_.get()) {
		Potassco::Span<std::string> in = !claspAppOpts_.input.empty() ? Potassco::toSpan(claspAppOpts_.input) : Potassco::toSpan(&stdinStr, 1);
		out_->run(getName(), getVersion(), Potassco::begin(in), Potassco::end(in));
	}
	try        { run(*clasp_); }
	catch(...) {
		try { blockSignals(); setExitCode(E_ERROR); throw; }
		catch (const std::bad_alloc&  ) { setExitCode(E_MEMORY); error("std::bad_alloc"); }
		catch (const std::exception& e) { error(e.what()); }
		catch (...)                     { ; }
	}
}